

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey-ssh1.c
# Opt level: O3

ssh_cipher * des3_pubkey_cipher(void *vkey)

{
  ssh_cipher *psVar1;
  uint8_t iv [8];
  uint8_t keys3 [24];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  psVar1 = des3_cbc3_new(&ssh_3des_ssh1);
  local_38 = *vkey;
  uStack_30 = *(undefined8 *)((long)vkey + 8);
  local_28 = *vkey;
  (*psVar1->vt->setkey)(psVar1,&local_38);
  smemclr(&local_38,0x18);
  local_40 = 0;
  (*psVar1->vt->setiv)(psVar1,&local_40);
  return psVar1;
}

Assistant:

static ssh_cipher *des3_pubkey_cipher(const void *vkey)
{
    ssh_cipher *c = ssh_cipher_new(&ssh_3des_ssh1);
    uint8_t keys3[24], iv[8];

    memcpy(keys3, vkey, 16);
    memcpy(keys3 + 16, vkey, 8);
    ssh_cipher_setkey(c, keys3);
    smemclr(keys3, sizeof(keys3));

    memset(iv, 0, 8);
    ssh_cipher_setiv(c, iv);

    return c;
}